

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float32 floatx80_to_float32_sparc(floatx80 a,float_status *status)

{
  commonNaNT a_00;
  _Bool _Var1;
  floatx80 a_01;
  floatx80 a_02;
  floatx80 a_03;
  floatx80 a_04;
  floatx80 a_05;
  commonNaNT local_50;
  uint64_t local_38;
  uint64_t aSig;
  int32_t aExp;
  flag aSign;
  float_status *status_local;
  floatx80 a_local;
  
  status_local = (float_status *)a.low;
  a_local.low._0_2_ = a.high;
  a_01._10_6_ = 0;
  a_01.low = (long)a._0_10_;
  a_01.high = (short)(a._0_10_ >> 0x40);
  _aExp = status;
  _Var1 = floatx80_invalid_encoding(a_01);
  if (_Var1) {
    float_raise_sparc('\x01',_aExp);
    a_local._12_4_ = float32_default_nan_sparc(_aExp);
  }
  else {
    a_02.high = (uint16_t)a_local.low;
    a_02.low = (uint64_t)status_local;
    a_02._10_6_ = 0;
    local_38 = extractFloatx80Frac(a_02);
    a_03.high = (uint16_t)a_local.low;
    a_03.low = (uint64_t)status_local;
    a_03._10_6_ = 0;
    aSig._0_4_ = extractFloatx80Exp(a_03);
    a_04.high = (uint16_t)a_local.low;
    a_04.low = (uint64_t)status_local;
    a_04._10_6_ = 0;
    aSig._7_1_ = extractFloatx80Sign(a_04);
    if ((int32_t)aSig == 0x7fff) {
      if ((local_38 & 0x7fffffffffffffff) == 0) {
        a_local._12_4_ = packFloat32(aSig._7_1_,0xff,0);
      }
      else {
        a_05.high = (uint16_t)a_local.low;
        a_05.low = (uint64_t)status_local;
        a_05._10_6_ = 0;
        floatx80ToCommonNaN(&local_50,a_05,_aExp);
        a_00.high = local_50.high;
        a_00.sign = local_50.sign;
        a_00._1_7_ = local_50._1_7_;
        a_00.low = local_50.low;
        a_local._12_4_ = commonNaNToFloat32(a_00,_aExp);
      }
    }
    else {
      shift64RightJamming(local_38,0x21,&local_38);
      if (((int32_t)aSig != 0) || (local_38 != 0)) {
        aSig._0_4_ = (int32_t)aSig + -0x3f81;
      }
      a_local._12_4_ = roundAndPackFloat32(aSig._7_1_,(int32_t)aSig,(uint32_t)local_38,_aExp);
    }
  }
  return a_local._12_4_;
}

Assistant:

float32 floatx80_to_float32(floatx80 a, float_status *status)
{
    flag aSign;
    int32_t aExp;
    uint64_t aSig;

    if (floatx80_invalid_encoding(a)) {
        float_raise(float_flag_invalid, status);
        return float32_default_nan(status);
    }
    aSig = extractFloatx80Frac( a );
    aExp = extractFloatx80Exp( a );
    aSign = extractFloatx80Sign( a );
    if ( aExp == 0x7FFF ) {
        if ( (uint64_t) ( aSig<<1 ) ) {
            return commonNaNToFloat32(floatx80ToCommonNaN(a, status), status);
        }
        return packFloat32( aSign, 0xFF, 0 );
    }
    shift64RightJamming( aSig, 33, &aSig );
    if ( aExp || aSig ) aExp -= 0x3F81;
    return roundAndPackFloat32(aSign, aExp, aSig, status);

}